

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O2

int If_ManNodeShapeMap(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vShape)

{
  Vec_Ptr_t *vVisited;
  uint uVar1;
  int iVar2;
  If_Obj_t *pIVar3;
  undefined4 *puVar4;
  If_Man_t *pIVar5;
  ulong uVar6;
  int i;
  
  uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
  if (uVar1 < 0x2000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSelect.c"
                  ,0x87,"int If_ManNodeShapeMap(If_Man_t *, If_Obj_t *, Vec_Int_t *)");
  }
  for (uVar6 = 0; uVar6 < uVar1 >> 0x18; uVar6 = uVar6 + 1) {
    pIVar3 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar6 * 4));
    if (pIVar3 == (If_Obj_t *)0x0) break;
    if ((pIVar3->CutBest).Area != 0.0) {
      __assert_fail("If_CutDataInt( If_ObjCutBest(pLeaf) ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSelect.c"
                    ,0x8b,"int If_ManNodeShapeMap(If_Man_t *, If_Obj_t *, Vec_Int_t *)");
    }
    (pIVar3->CutBest).Area = 1.4013e-45;
    uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
  }
  vShape->nSize = 0;
  vVisited = pIfMan->vTemp;
  vVisited->nSize = 0;
  pIVar5 = pIfMan;
  iVar2 = If_ManNodeShapeMap_rec(pIfMan,pIfObj,vVisited,vShape);
  if (iVar2 == -1) {
    iVar2 = 0;
    Abc_Print((int)pIVar5,"If_ManNodeShapeMap(): Computing local AIG has failed.\n");
  }
  else {
    for (uVar6 = 0; uVar6 < (byte)(pIfObj->CutBest).field_0x1f; uVar6 = uVar6 + 1) {
      pIVar3 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar6 * 4));
      if (pIVar3 == (If_Obj_t *)0x0) break;
      (pIVar3->CutBest).Area = 0.0;
    }
    iVar2 = 1;
    for (i = 0; i < pIfMan->vTemp->nSize; i = i + 1) {
      puVar4 = (undefined4 *)Vec_PtrEntry(pIfMan->vTemp,i);
      *puVar4 = 0;
    }
  }
  return iVar2;
}

Assistant:

int If_ManNodeShapeMap( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vShape )
{
    If_Cut_t * pCut;
    If_Obj_t * pLeaf;
    int i, iRes;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
    {
        assert( If_CutDataInt( If_ObjCutBest(pLeaf) ) == 0 );
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 1 );
    }
    // recursively compute the function while collecting visited cuts
    Vec_IntClear( vShape );
    Vec_PtrClear( pIfMan->vTemp );
    iRes = If_ManNodeShapeMap_rec( pIfMan, pIfObj, pIfMan->vTemp, vShape ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "If_ManNodeShapeMap(): Computing local AIG has failed.\n" );
        return 0;
    }
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 0 );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetDataInt( pCut, 0 );
    return 1;
}